

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<Js::FunctionBody*,Js::FunctionBody*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,FunctionBody **key,FunctionBody **value)

{
  Type *pTVar1;
  uint uVar2;
  FunctionBody *pFVar3;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar4;
  int *piVar5;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar6;
  code *pcVar7;
  WriteBarrierPtr<Js::FunctionBody> WVar8;
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  bool bVar10;
  int iVar11;
  undefined4 *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  WriteBarrierPtr<Js::FunctionBody> local_70;
  FunctionBody **local_68;
  long local_60;
  FunctionBody **local_58;
  FunctionBody *local_50;
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_48;
  ulong local_40;
  uint local_34;
  
  lVar16 = *(long *)this;
  local_68 = value;
  if (lVar16 == 0) {
    BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar16 = *(long *)this;
  }
  uVar14 = (uint)((ulong)*key >> 3) | 1;
  local_40 = (ulong)uVar14;
  local_58 = key;
  local_34 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket(uVar14,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar16 + (ulong)local_34 * 4);
  local_48 = (BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar14 < 0) {
    uVar15 = 0;
  }
  else {
    lVar16 = *(long *)(this + 8);
    uVar15 = 0;
    do {
      pFVar3 = *(FunctionBody **)(lVar16 + (ulong)uVar14 * 0x10);
      Memory::Recycler::WBSetBit((char *)&local_50);
      local_50 = pFVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
      if (local_50 == *local_58) {
        if (local_48->stats == (DictionaryStats *)0x0) {
          return -1;
        }
        DictionaryStats::Lookup(local_48->stats,uVar15);
        return -1;
      }
      uVar15 = uVar15 + 1;
      uVar14 = *(uint *)((ulong)uVar14 * 0x10 + lVar16 + 8);
    } while (-1 < (int)uVar14);
  }
  pBVar9 = local_48;
  if (local_48->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_48->stats,uVar15);
  }
  if (pBVar9->freeCount == 0) {
    uVar14 = pBVar9->size;
    uVar2 = pBVar9->count;
    if (uVar2 == uVar14) {
      BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Resize(pBVar9);
      local_34 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((hash_t)local_40,pBVar9->bucketCount,pBVar9->modFunctionIndex);
      uVar14 = pBVar9->size;
      uVar2 = pBVar9->count;
    }
    uVar13 = (ulong)uVar2;
    pBVar9->count = uVar2 + 1;
    if ((int)uVar14 < (int)(uVar2 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f1,"(count <= size)","count <= size");
      if (!bVar10) goto LAB_008ff53d;
      *puVar12 = 0;
      uVar14 = pBVar9->size;
    }
    if ((int)uVar14 <= (int)uVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f2,"(index < size)","index < size");
      if (!bVar10) goto LAB_008ff53d;
      *puVar12 = 0;
    }
  }
  else {
    if (pBVar9->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar10) goto LAB_008ff53d;
      *puVar12 = 0;
    }
    uVar14 = pBVar9->freeList;
    if ((int)uVar14 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar10) goto LAB_008ff53d;
      *puVar12 = 0;
      uVar14 = pBVar9->freeList;
    }
    if (pBVar9->count <= (int)uVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar10) {
LAB_008ff53d:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar12 = 0;
      uVar14 = pBVar9->freeList;
    }
    uVar13 = (ulong)uVar14;
    pTVar1 = &pBVar9->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar11 = BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex((pBVar9->entries).ptr + (int)uVar14);
      pBVar9->freeList = iVar11;
    }
  }
  pSVar4 = (pBVar9->entries).ptr;
  lVar16 = (long)(int)uVar13;
  pSVar6 = pSVar4 + lVar16;
  pFVar3 = *local_58;
  local_60 = lVar16;
  local_40 = uVar13;
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50 = pFVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  pFVar3 = *local_68;
  Memory::Recycler::WBSetBit((char *)&local_70);
  local_70.ptr = pFVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
  WVar8.ptr = local_70.ptr;
  Memory::Recycler::WBSetBit((char *)pSVar6);
  uVar13 = local_40;
  pBVar9 = local_48;
  pSVar4[lVar16].
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .
  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr = WVar8.ptr;
  iVar11 = (int)local_40;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar6);
  piVar5 = (pBVar9->buckets).ptr;
  pSVar6 = (pBVar9->entries).ptr;
  pSVar6[lVar16].
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .
  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next = piVar5[local_34];
  piVar5[local_34] = (int)local_60;
  uVar15 = 0;
  uVar13 = uVar13 & 0xffffffff;
  do {
    uVar14 = pSVar6[(int)uVar13].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
             .
             super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
             .
             super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
             .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
    uVar13 = (ulong)uVar14;
    uVar15 = uVar15 + 1;
  } while (uVar14 != 0xffffffff);
  if (pBVar9->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(pBVar9->stats,uVar15);
  }
  return iVar11;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }